

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O2

int Gia_ManLutLevel(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  void *__ptr;
  int *piVar3;
  Gia_Obj_t *pObj;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar1 = p->nObjs;
  __ptr = calloc((long)iVar1,4);
  for (lVar6 = 1; iVar4 = (int)lVar6, lVar6 < iVar1; lVar6 = lVar6 + 1) {
    iVar1 = Gia_ObjIsLut(p,iVar4);
    if (iVar1 != 0) {
      lVar5 = 0;
      iVar1 = 0;
      while( true ) {
        iVar2 = Gia_ObjLutSize(p,iVar4);
        if (iVar2 <= lVar5) break;
        piVar3 = Gia_ObjLutFanins(p,iVar4);
        iVar2 = *(int *)((long)__ptr + (long)piVar3[lVar5] * 4);
        if (iVar1 <= iVar2) {
          iVar1 = iVar2;
        }
        lVar5 = lVar5 + 1;
      }
      *(int *)((long)__ptr + lVar6 * 4) = iVar1 + 1;
    }
    iVar1 = p->nObjs;
  }
  iVar1 = 0;
  for (iVar4 = 0; iVar4 < p->vCos->nSize; iVar4 = iVar4 + 1) {
    pObj = Gia_ManCo(p,iVar4);
    if (pObj == (Gia_Obj_t *)0x0) break;
    iVar2 = Gia_ObjFaninId0p(p,pObj);
    if (iVar1 < *(int *)((long)__ptr + (long)iVar2 * 4)) {
      iVar1 = Gia_ObjFaninId0p(p,pObj);
      iVar1 = *(int *)((long)__ptr + (long)iVar1 * 4);
    }
  }
  free(__ptr);
  return iVar1;
}

Assistant:

int Gia_ManLutLevel( Gia_Man_t * p )
{
    Gia_Obj_t * pObj;
    int i, k, iFan, Level;
    int * pLevels = ABC_CALLOC( int, Gia_ManObjNum(p) );
    Gia_ManForEachLut( p, i )
    {
        Level = 0;
        Gia_LutForEachFanin( p, i, iFan, k )
            if ( Level < pLevels[iFan] )
                Level = pLevels[iFan];
        pLevels[i] = Level + 1;
    }
    Level = 0;
    Gia_ManForEachCo( p, pObj, k )
        if ( Level < pLevels[Gia_ObjFaninId0p(p, pObj)] )
            Level = pLevels[Gia_ObjFaninId0p(p, pObj)];
    ABC_FREE( pLevels );
    return Level;
}